

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.cpp
# Opt level: O1

Token * __thiscall EOPlus::Lexer::ReadNumber(Token *__return_storage_ptr__,Lexer *this)

{
  size_type sVar1;
  variant *pvVar2;
  bool bVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  int i;
  int iVar5;
  char c;
  char local_109;
  code *local_108 [2];
  code *local_f8;
  code *pcStack_f0;
  Token *local_e0;
  function<bool_(char)> local_d8;
  variant local_b0;
  variant local_70;
  
  local_109 = '\0';
  local_d8.super__Function_base._M_functor._8_8_ = 0;
  local_d8.super__Function_base._M_functor._M_unused._M_object = ctype_digit;
  local_d8._M_invoker = std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_invoke;
  local_d8.super__Function_base._M_manager =
       std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_manager;
  bVar3 = GetCharIf(this,&local_109,&local_d8);
  if (local_d8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_d8.super__Function_base._M_manager)
              ((_Any_data *)&local_d8,(_Any_data *)&local_d8,__destroy_functor);
  }
  if (bVar3) {
    i = local_109 + -0x30;
    local_e0 = __return_storage_ptr__;
    while( true ) {
      local_108[1] = (code *)0x0;
      local_108[0] = ctype_digit;
      pcStack_f0 = std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_invoke;
      local_f8 = std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_manager;
      bVar3 = GetCharIf(this,&local_109,(function<bool_(char)> *)local_108);
      if (local_f8 != (code *)0x0) {
        (*local_f8)((_Any_data *)local_108,(_Any_data *)local_108,__destroy_functor);
      }
      if (!bVar3) break;
      iVar5 = i * 10 + -0x30;
      if (0xccccccc < i) {
        iVar5 = -0x3a;
      }
      i = iVar5 + local_109;
    }
    util::variant::variant(&local_b0,i);
    __return_storage_ptr__ = local_e0;
    local_e0->type = Integer;
    (local_e0->data).val_int = local_b0.val_int;
    *(undefined4 *)&(local_e0->data).field_0x4 = local_b0._4_4_;
    *(undefined4 *)&(local_e0->data).val_float = local_b0.val_float._0_4_;
    *(undefined4 *)((long)&(local_e0->data).val_float + 4) = local_b0.val_float._4_4_;
    (local_e0->data).val_string._M_dataplus._M_p = (pointer)&(local_e0->data).val_string.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(local_e0->data).val_string,local_b0.val_string._M_dataplus._M_p,
               local_b0.val_string._M_dataplus._M_p + local_b0.val_string._M_string_length);
    pvVar2 = &local_b0;
  }
  else {
    util::variant::variant(&local_70);
    __return_storage_ptr__->type = Invalid;
    (__return_storage_ptr__->data).val_int = local_70.val_int;
    *(undefined4 *)&(__return_storage_ptr__->data).field_0x4 = local_70._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->data).val_float = local_70.val_float._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->data).val_float + 4) = local_70.val_float._4_4_;
    (__return_storage_ptr__->data).val_string._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->data).val_string.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(__return_storage_ptr__->data).val_string,
               local_70.val_string._M_dataplus._M_p,
               local_70.val_string._M_dataplus._M_p + local_70.val_string._M_string_length);
    pvVar2 = &local_70;
  }
  paVar4 = &(pvVar2->val_string).field_2;
  (__return_storage_ptr__->data).type = *(var_type *)(&paVar4->_M_allocated_capacity + 3);
  sVar1 = (&paVar4->_M_allocated_capacity)[2];
  (__return_storage_ptr__->data).val_bool = (bool)(char)sVar1;
  (__return_storage_ptr__->data).cache_val[0] = (bool)(char)(sVar1 >> 8);
  (__return_storage_ptr__->data).cache_val[1] = (bool)(char)(sVar1 >> 0x10);
  (__return_storage_ptr__->data).cache_val[2] = (bool)(char)(sVar1 >> 0x18);
  (__return_storage_ptr__->data).cache_val[3] = (bool)(char)(sVar1 >> 0x20);
  *(int3 *)&(__return_storage_ptr__->data).field_0x35 = (int3)(sVar1 >> 0x28);
  __return_storage_ptr__->newlines = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(&paVar4->_M_allocated_capacity)[-2] != paVar4) {
    operator_delete((undefined1 *)(&paVar4->_M_allocated_capacity)[-2],
                    paVar4->_M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::ReadNumber()
	{
		char c = '\0';

		if (!this->GetCharIf(c, ctype_digit))
			return Token();

		int number = (c - '0');

		while (this->GetCharIf(c, ctype_digit))
		{
			if (number > std::numeric_limits<int>::max() / 10)
				number = std::numeric_limits<int>::max();

			number *= 10;
			number += (c - '0');
		}

		return Token(Token::Integer, number);
	}